

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

NeuralNetworkClassifier * __thiscall
CoreML::Specification::NeuralNetworkClassifier::New(NeuralNetworkClassifier *this,Arena *arena)

{
  NeuralNetworkClassifier *this_00;
  
  this_00 = (NeuralNetworkClassifier *)operator_new(0x68);
  NeuralNetworkClassifier(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::NeuralNetworkClassifier>(arena,this_00);
  }
  return this_00;
}

Assistant:

NeuralNetworkClassifier* NeuralNetworkClassifier::New(::google::protobuf::Arena* arena) const {
  NeuralNetworkClassifier* n = new NeuralNetworkClassifier;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}